

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  _func_int ***ppp_Var1;
  bool bVar2;
  BlockEntry *pBVar3;
  Cluster *pCVar4;
  _func_int ***ppp_Var5;
  long lVar6;
  _func_int ***ppp_Var7;
  Cluster **ppCVar8;
  long lVar9;
  
  ppCVar8 = this->m_clusters;
  lVar9 = this->m_clusterPreloadCount;
  pBVar3 = (BlockEntry *)(ppCVar8 + this->m_clusterCount);
  ppp_Var1 = &pBVar3->_vptr_BlockEntry;
  ppp_Var7 = ppp_Var1 + lVar9;
  while( true ) {
    if (ppp_Var7 <= ppCVar8) {
      if (ppCVar8 != (Cluster **)ppp_Var7) {
        __assert_fail("i == j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x889,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      pCVar4 = Cluster::Create(this,-1,tp->m_pos);
      if (pCVar4 != (Cluster *)0x0) {
        lVar9 = (long)ppCVar8 - (long)this->m_clusters;
        bVar2 = PreloadCluster(this,pCVar4,lVar9 >> 3);
        if (bVar2) {
          if (this->m_clusters == (Cluster **)0x0) {
            __assert_fail("m_clusters",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x896,
                          "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                         );
          }
          if (0 < this->m_clusterPreloadCount) {
            if (*(Cluster **)((long)this->m_clusters + lVar9) == pCVar4) {
              pBVar3 = Cluster::GetEntry(pCVar4,cp,tp);
              return pBVar3;
            }
            __assert_fail("m_clusters[idx] == pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x898,
                          "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                         );
          }
          __assert_fail("m_clusterPreloadCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x897,
                        "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                       );
        }
        Cluster::~Cluster(pCVar4);
        operator_delete(pCVar4);
      }
      return (BlockEntry *)0x0;
    }
    ppp_Var5 = (_func_int ***)
               ((((long)ppp_Var7 - (long)ppCVar8 >> 3) - ((long)ppp_Var7 - (long)ppCVar8 >> 0x3f) &
                0xfffffffffffffffeU) * 4 + (long)ppCVar8);
    if (ppp_Var1 + lVar9 <= ppp_Var5) {
      __assert_fail("k < jj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x875,
                    "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                   );
    }
    pCVar4 = (Cluster *)*ppp_Var5;
    if (pCVar4 == (Cluster *)0x0) break;
    lVar6 = pCVar4->m_element_start - pCVar4->m_pSegment->m_start;
    if (lVar6 < 0) {
      __assert_fail("pos >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1ac6,"long long mkvparser::Cluster::GetPosition() const");
    }
    if (lVar6 < tp->m_pos) {
      ppCVar8 = (Cluster **)(ppp_Var5 + 1);
      bVar2 = true;
      ppp_Var5 = ppp_Var7;
    }
    else {
      bVar2 = true;
      if (lVar6 <= tp->m_pos) {
        pBVar3 = Cluster::GetEntry(pCVar4,cp,tp);
        bVar2 = false;
        ppp_Var5 = ppp_Var7;
      }
    }
    ppp_Var7 = ppp_Var5;
    if (!bVar2) {
      return pBVar3;
    }
  }
  __assert_fail("pCluster",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x878,
                "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
               );
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}